

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::number::impl::DecimalQuantity::toString
          (UnicodeString *__return_storage_ptr__,DecimalQuantity *this)

{
  uint uVar1;
  uint uVar2;
  int8_t iVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  char *local_138;
  int32_t local_114;
  uint local_104;
  char local_c8 [8];
  char buffer8 [100];
  uint local_54;
  undefined1 local_50 [4];
  int32_t i;
  MaybeStackArray<char,_30> digits;
  DecimalQuantity *this_local;
  
  digits._40_8_ = this;
  MaybeStackArray<char,_30>::MaybeStackArray
            ((MaybeStackArray<char,_30> *)local_50,this->precision + 1);
  for (local_54 = 0; (int)local_54 < this->precision; local_54 = local_54 + 1) {
    iVar3 = getDigitPos(this,~local_54 + this->precision);
    pcVar5 = MaybeStackArray<char,_30>::operator[]
                       ((MaybeStackArray<char,_30> *)local_50,(long)(int)local_54);
    *pcVar5 = iVar3 + '0';
  }
  pcVar5 = MaybeStackArray<char,_30>::operator[]
                     ((MaybeStackArray<char,_30> *)local_50,(long)this->precision);
  *pcVar5 = '\0';
  if (this->lOptPos < 1000) {
    local_104 = this->lOptPos;
  }
  else {
    local_104 = 999;
  }
  uVar1 = this->lReqPos;
  uVar2 = this->rReqPos;
  if (this->rOptPos < -999) {
    local_114 = -999;
  }
  else {
    local_114 = this->rOptPos;
  }
  pcVar5 = "long";
  if ((this->usingBytes & 1U) != 0) {
    pcVar5 = "bytes";
  }
  bVar4 = isNegative(this);
  pcVar6 = "";
  if (bVar4) {
    pcVar6 = "-";
  }
  if (this->precision == 0) {
    local_138 = "0";
  }
  else {
    local_138 = MaybeStackArray<char,_30>::getAlias((MaybeStackArray<char,_30> *)local_50);
  }
  snprintf(local_c8,100,"<DecimalQuantity %d:%d:%d:%d %s %s%s%s%d>",(ulong)local_104,(ulong)uVar1,
           (ulong)uVar2,local_114,pcVar5,pcVar6,local_138,"E",this->scale);
  UnicodeString::UnicodeString(__return_storage_ptr__,local_c8,-1,kInvariant);
  MaybeStackArray<char,_30>::~MaybeStackArray((MaybeStackArray<char,_30> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalQuantity::toString() const {
    MaybeStackArray<char, 30> digits(precision + 1);
    for (int32_t i = 0; i < precision; i++) {
        digits[i] = getDigitPos(precision - i - 1) + '0';
    }
    digits[precision] = 0; // terminate buffer
    char buffer8[100];
    snprintf(
            buffer8,
            sizeof(buffer8),
            "<DecimalQuantity %d:%d:%d:%d %s %s%s%s%d>",
            (lOptPos > 999 ? 999 : lOptPos),
            lReqPos,
            rReqPos,
            (rOptPos < -999 ? -999 : rOptPos),
            (usingBytes ? "bytes" : "long"),
            (isNegative() ? "-" : ""),
            (precision == 0 ? "0" : digits.getAlias()),
            "E",
            scale);
    return UnicodeString(buffer8, -1, US_INV);
}